

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O3

void __thiscall
duckdb::Binder::AddUsingBindingSet
          (Binder *this,
          unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true> *set
          )

{
  shared_ptr<duckdb::Binder,_true> *this_00;
  _Head_base<0UL,_duckdb::UsingColumnSet_*,_false> local_10;
  
  if ((this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    this_00 = &this->parent;
    do {
      this = shared_ptr<duckdb::Binder,_true>::operator*(this_00);
      this_00 = &this->parent;
    } while ((this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr != (element_type *)0x0);
  }
  local_10._M_head_impl =
       (set->super_unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>)
       ._M_t.
       super___uniq_ptr_impl<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::UsingColumnSet_*,_std::default_delete<duckdb::UsingColumnSet>_>
       .super__Head_base<0UL,_duckdb::UsingColumnSet_*,_false>._M_head_impl;
  (set->super_unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>)._M_t
  .super___uniq_ptr_impl<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::UsingColumnSet_*,_std::default_delete<duckdb::UsingColumnSet>_>.
  super__Head_base<0UL,_duckdb::UsingColumnSet_*,_false>._M_head_impl = (UsingColumnSet *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::UsingColumnSet,std::default_delete<duckdb::UsingColumnSet>,true>,std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,std::default_delete<duckdb::UsingColumnSet>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::UsingColumnSet,std::default_delete<duckdb::UsingColumnSet>,true>>
            ((vector<duckdb::unique_ptr<duckdb::UsingColumnSet,std::default_delete<duckdb::UsingColumnSet>,true>,std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,std::default_delete<duckdb::UsingColumnSet>,true>>>
              *)&(this->bind_context).using_column_sets,
             (unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
              *)&local_10);
  if (local_10._M_head_impl != (UsingColumnSet *)0x0) {
    ::std::default_delete<duckdb::UsingColumnSet>::operator()
              ((default_delete<duckdb::UsingColumnSet> *)&local_10,local_10._M_head_impl);
  }
  return;
}

Assistant:

void Binder::AddUsingBindingSet(unique_ptr<UsingColumnSet> set) {
	auto &root_binder = GetRootBinder();
	root_binder.bind_context.AddUsingBindingSet(std::move(set));
}